

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::~LinkedListPool
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  pointer ppaVar1;
  pointer ppaVar2;
  
  ppaVar1 = (this->v_).
            super__Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppaVar2 = (this->v_).
                 super__Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppaVar2 != ppaVar1;
      ppaVar2 = ppaVar2 + 1) {
    ::free(*ppaVar2);
  }
  std::_Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
  ::~_Vector_base((_Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
                   *)this);
  return;
}

Assistant:

~LinkedListPool()
  {
    typename vector_t::const_iterator const itend = v_.end();
    for(typename vector_t::const_iterator it = v_.begin(); it != itend; ++it)
      PoolAllocator_malloc_free<SCALABLE>::free(reinterpret_cast<char*>(*it));
  }